

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HTMLGeneration.cpp
# Opt level: O0

void __thiscall
soul::HTMLGenerator::printStructs(HTMLGenerator *this,HTMLElement *parent,Module *module)

{
  Module *parent_00;
  bool bVar1;
  pointer *ppHVar2;
  HTMLElement *pHVar3;
  HTMLElement *pHVar4;
  char *in_R8;
  string_view sVar5;
  string_view classType;
  string_view local_1c0;
  string_view local_1b0;
  string_view local_1a0;
  string_view local_190;
  string_view local_180;
  string_view local_170;
  string_view local_160;
  HTMLElement *local_150;
  HTMLElement *memberLine;
  char *local_140;
  string_view local_138;
  HTMLElement *local_128;
  HTMLElement *memberDiv;
  Member *member;
  const_iterator __end4;
  const_iterator __begin4;
  vector<soul::SourceCodeModel::Struct::Member,_std::allocator<soul::SourceCodeModel::Struct::Member>_>
  *__range4;
  string_view local_f0;
  string_view local_e0;
  string_view local_d0;
  string_view local_c0;
  HTMLElement *local_b0;
  HTMLElement *start;
  HTMLElement *local_98;
  HTMLElement *codeDiv;
  char *local_88;
  string_view local_80;
  string_view local_70;
  HTMLElement *local_60;
  HTMLElement *structDiv;
  Struct *s;
  const_iterator __end3;
  const_iterator __begin3;
  vector<soul::SourceCodeModel::Struct,_std::allocator<soul::SourceCodeModel::Struct>_> *__range3;
  HTMLElement *local_28;
  HTMLElement *section;
  Module *module_local;
  HTMLElement *parent_local;
  HTMLGenerator *this_local;
  
  section = (HTMLElement *)module;
  module_local = (Module *)parent;
  parent_local = (HTMLElement *)this;
  bVar1 = std::vector<soul::SourceCodeModel::Struct,_std::allocator<soul::SourceCodeModel::Struct>_>
          ::empty(&module->structs);
  parent_00 = module_local;
  if (!bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&__range3,"Structures");
    local_28 = createModuleSection(this,(HTMLElement *)parent_00,___range3);
    ppHVar2 = &section[3].children.
               super__Vector_base<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    __end3 = std::
             vector<soul::SourceCodeModel::Struct,_std::allocator<soul::SourceCodeModel::Struct>_>::
             begin((vector<soul::SourceCodeModel::Struct,_std::allocator<soul::SourceCodeModel::Struct>_>
                    *)ppHVar2);
    s = (Struct *)
        std::vector<soul::SourceCodeModel::Struct,_std::allocator<soul::SourceCodeModel::Struct>_>::
        end((vector<soul::SourceCodeModel::Struct,_std::allocator<soul::SourceCodeModel::Struct>_> *
            )ppHVar2);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end3,(__normal_iterator<const_soul::SourceCodeModel::Struct_*,_std::vector<soul::SourceCodeModel::Struct,_std::allocator<soul::SourceCodeModel::Struct>_>_>
                                  *)&s);
      if (!bVar1) break;
      structDiv = (HTMLElement *)
                  __gnu_cxx::
                  __normal_iterator<const_soul::SourceCodeModel::Struct_*,_std::vector<soul::SourceCodeModel::Struct,_std::allocator<soul::SourceCodeModel::Struct>_>_>
                  ::operator*(&__end3);
      pHVar3 = local_28;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_70,"struct");
      pHVar3 = choc::html::HTMLElement::addDiv(pHVar3,local_70);
      sVar5 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view
                        ((string *)&structDiv->children);
      local_80 = sVar5;
      pHVar4 = choc::html::HTMLElement::setID(pHVar3,sVar5);
      pHVar3 = structDiv;
      local_60 = pHVar4;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&codeDiv,"summary");
      sVar5._M_str = in_R8;
      sVar5._M_len = (size_t)local_88;
      addComment((HTMLGenerator *)pHVar4,pHVar3,(Comment *)codeDiv,sVar5);
      pHVar3 = local_60;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&start,"listing");
      local_98 = choc::html::HTMLElement::addDiv(pHVar3,_start);
      pHVar3 = choc::html::HTMLElement::addParagraph(local_98);
      local_b0 = pHVar3;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_c0,"keyword");
      pHVar3 = choc::html::HTMLElement::addSpan(pHVar3,local_c0);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_d0,"struct ");
      choc::html::HTMLElement::addContent(pHVar3,local_d0);
      pHVar3 = local_b0;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_e0,"struct_name");
      pHVar3 = choc::html::HTMLElement::addSpan(pHVar3,local_e0);
      sVar5 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view
                        ((string *)&structDiv[1].properties);
      local_f0 = sVar5;
      choc::html::HTMLElement::addContent(pHVar3,sVar5);
      pHVar3 = choc::html::HTMLElement::addLineBreak(local_b0);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&__range4,"{");
      pHVar3 = choc::html::HTMLElement::addContent(pHVar3,___range4);
      choc::html::HTMLElement::addLineBreak(pHVar3);
      ppHVar2 = &structDiv[1].children.
                 super__Vector_base<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      __end4 = std::
               vector<soul::SourceCodeModel::Struct::Member,_std::allocator<soul::SourceCodeModel::Struct::Member>_>
               ::begin((vector<soul::SourceCodeModel::Struct::Member,_std::allocator<soul::SourceCodeModel::Struct::Member>_>
                        *)ppHVar2);
      member = (Member *)
               std::
               vector<soul::SourceCodeModel::Struct::Member,_std::allocator<soul::SourceCodeModel::Struct::Member>_>
               ::end((vector<soul::SourceCodeModel::Struct::Member,_std::allocator<soul::SourceCodeModel::Struct::Member>_>
                      *)ppHVar2);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          (&__end4,(__normal_iterator<const_soul::SourceCodeModel::Struct::Member_*,_std::vector<soul::SourceCodeModel::Struct::Member,_std::allocator<soul::SourceCodeModel::Struct::Member>_>_>
                                    *)&member);
        if (!bVar1) break;
        memberDiv = (HTMLElement *)
                    __gnu_cxx::
                    __normal_iterator<const_soul::SourceCodeModel::Struct::Member_*,_std::vector<soul::SourceCodeModel::Struct::Member,_std::allocator<soul::SourceCodeModel::Struct::Member>_>_>
                    ::operator*(&__end4);
        pHVar3 = choc::html::HTMLElement::addDiv(local_98);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_138,"struct_member");
        pHVar4 = choc::html::HTMLElement::setClass(pHVar3,local_138);
        pHVar3 = memberDiv;
        local_128 = pHVar4;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)&memberLine,"summary");
        classType._M_str = in_R8;
        classType._M_len = (size_t)local_140;
        addComment((HTMLGenerator *)pHVar4,pHVar3,(Comment *)memberLine,classType);
        pHVar3 = local_128;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_160,"listing");
        local_150 = choc::html::HTMLElement::addDiv(pHVar3,local_160);
        printExpression(this,local_150,(Expression *)&memberDiv->children);
        pHVar3 = local_150;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_170," ");
        pHVar3 = choc::html::HTMLElement::addContent(pHVar3,local_170);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_180,"member_name");
        pHVar3 = choc::html::HTMLElement::addSpan(pHVar3,local_180);
        sVar5 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view
                          ((string *)&memberDiv[1].isContent);
        local_190 = sVar5;
        choc::html::HTMLElement::addContent(pHVar3,sVar5);
        pHVar3 = local_150;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1a0,";");
        pHVar3 = choc::html::HTMLElement::addContent(pHVar3,local_1a0);
        choc::html::HTMLElement::addLineBreak(pHVar3);
        __gnu_cxx::
        __normal_iterator<const_soul::SourceCodeModel::Struct::Member_*,_std::vector<soul::SourceCodeModel::Struct::Member,_std::allocator<soul::SourceCodeModel::Struct::Member>_>_>
        ::operator++(&__end4);
      }
      pHVar3 = choc::html::HTMLElement::addParagraph(local_98);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_1b0,"code_block");
      pHVar3 = choc::html::HTMLElement::setClass(pHVar3,local_1b0);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1c0,"}");
      choc::html::HTMLElement::addContent(pHVar3,local_1c0);
      __gnu_cxx::
      __normal_iterator<const_soul::SourceCodeModel::Struct_*,_std::vector<soul::SourceCodeModel::Struct,_std::allocator<soul::SourceCodeModel::Struct>_>_>
      ::operator++(&__end3);
    }
  }
  return;
}

Assistant:

void printStructs (choc::html::HTMLElement& parent, const SourceCodeModel::Module& module)
    {
        if (! module.structs.empty())
        {
            auto& section = createModuleSection (parent, "Structures");

            for (auto& s : module.structs)
            {
                auto& structDiv = section.addDiv ("struct").setID (s.UID);

                addComment (structDiv, s.comment, "summary");

                auto& codeDiv = structDiv.addDiv ("listing");

                auto& start = codeDiv.addParagraph();
                start.addSpan ("keyword").addContent ("struct ");
                start.addSpan ("struct_name").addContent (s.shortName);
                start.addLineBreak().addContent ("{").addLineBreak();

                for (auto& member : s.members)
                {
                    auto& memberDiv = codeDiv.addDiv().setClass ("struct_member");

                    addComment (memberDiv, member.comment, "summary");

                    auto& memberLine = memberDiv.addDiv ("listing");
                    printExpression (memberLine, member.type);
                    memberLine.addContent (" ").addSpan ("member_name").addContent (member.name);
                    memberLine.addContent (";").addLineBreak();
                }

                codeDiv.addParagraph().setClass ("code_block")
                       .addContent ("}");
            }
        }
    }